

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.h
# Opt level: O0

StringFeatureType * __thiscall
CoreML::Specification::DictionaryFeatureType::mutable_stringkeytype(DictionaryFeatureType *this)

{
  bool bVar1;
  StringFeatureType *this_00;
  DictionaryFeatureType *this_local;
  
  bVar1 = has_stringkeytype(this);
  if (!bVar1) {
    clear_KeyType(this);
    set_has_stringkeytype(this);
    this_00 = (StringFeatureType *)operator_new(0x18);
    StringFeatureType::StringFeatureType(this_00);
    (this->KeyType_).stringkeytype_ = this_00;
  }
  return (StringFeatureType *)(this->KeyType_).int64keytype_;
}

Assistant:

inline ::CoreML::Specification::StringFeatureType* DictionaryFeatureType::mutable_stringkeytype() {
  if (!has_stringkeytype()) {
    clear_KeyType();
    set_has_stringkeytype();
    KeyType_.stringkeytype_ = new ::CoreML::Specification::StringFeatureType;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.DictionaryFeatureType.stringKeyType)
  return KeyType_.stringkeytype_;
}